

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Ix<(moira::Mode)10,_2> wrapper)

{
  Syntax SVar1;
  StrWriter *this_local;
  Ix<(moira::Mode)10,_2> wrapper_local;
  
  SVar1 = this->style->syntax;
  if ((SVar1 == MOIRA_MIT) || (SVar1 == GNU_MIT)) {
    operator<<(this,(IxMit<(moira::Mode)10,_2>)wrapper.ea);
  }
  else if (SVar1 == MUSASHI) {
    operator<<(this,(IxMus<(moira::Mode)10,_2>)wrapper.ea);
  }
  else {
    operator<<(this,(IxMot<(moira::Mode)10,_2>)wrapper.ea);
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Ix<M, S> wrapper)
{
    switch (style.syntax) {

        case Syntax::MUSASHI:

            *this << IxMus<M, S>{wrapper.ea};
            break;

        case Syntax::GNU_MIT:
        case Syntax::MOIRA_MIT:

            *this << IxMit<M, S>{wrapper.ea};
            break;

        default:

            *this << IxMot<M, S>{wrapper.ea};
    }

    return *this;
}